

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric_utils.hpp
# Opt level: O0

unsigned_long duckdb::NumericCastImpl<unsigned_long,_long,_false>::Convert(long val)

{
  unsigned_long uVar1;
  unsigned_long uVar2;
  ulong in_RDI;
  type signed_max;
  type signed_min;
  type signed_in;
  type unsigned_max;
  type unsigned_min;
  type unsigned_in;
  unsigned_long maxval;
  unsigned_long minval;
  
  uVar1 = NumericLimits<unsigned_long>::Minimum();
  uVar2 = NumericLimits<unsigned_long>::Maximum();
  if (((long)in_RDI < (long)uVar1) || (uVar2 < in_RDI)) {
    ThrowNumericCastError<unsigned_long,long>(signed_in,signed_min,signed_max);
  }
  return in_RDI;
}

Assistant:

static TO Convert(FROM val) {
		// some dance around signed-unsigned integer comparison below
		auto minval = NumericLimits<TO>::Minimum();
		auto maxval = NumericLimits<TO>::Maximum();
		auto unsigned_in = static_cast<typename MakeUnsigned<FROM>::type>(val);
		auto unsigned_min = static_cast<typename MakeUnsigned<TO>::type>(minval);
		auto unsigned_max = static_cast<typename MakeUnsigned<TO>::type>(maxval);
		auto signed_in = static_cast<typename MakeSigned<FROM>::type>(val);
		auto signed_min = static_cast<typename MakeSigned<TO>::type>(minval);
		auto signed_max = static_cast<typename MakeSigned<TO>::type>(maxval);

		if (!NumericLimits<FROM>::IsSigned() && !NumericLimits<TO>::IsSigned() &&
		    (unsigned_in < unsigned_min || unsigned_in > unsigned_max)) {
			ThrowNumericCastError(val, static_cast<TO>(unsigned_min), static_cast<TO>(unsigned_max));
		}

		if (NumericLimits<FROM>::IsSigned() && NumericLimits<TO>::IsSigned() &&
		    (signed_in < signed_min || signed_in > signed_max)) {
			ThrowNumericCastError(val, static_cast<TO>(signed_min), static_cast<TO>(signed_max));
		}

		if (NumericLimits<FROM>::IsSigned() != NumericLimits<TO>::IsSigned() &&
		    (signed_in < signed_min || unsigned_in > unsigned_max)) {
			ThrowNumericCastError(val, static_cast<TO>(signed_min), static_cast<TO>(unsigned_max));
		}

		return static_cast<TO>(val);
	}